

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace.c
# Opt level: O3

parasail_result_t *
parasail_sw_trace(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong size;
  int iVar16;
  ulong size_00;
  int iVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int local_a8;
  int *local_68;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_trace_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_trace_cold_6();
  }
  else if (open < 0) {
    parasail_sw_trace_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_trace_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_trace_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_trace_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_trace_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    ppVar7 = parasail_result_new_trace(_s1Len,s2Len,0x10,1);
    if (ppVar7 != (parasail_result_t *)0x0) {
      ppVar7->flag = ppVar7->flag | 0x1480104;
      size_00 = (ulong)(uint)s2Len;
      ptr = parasail_memalign_int(0x10,size_00);
      size = (ulong)(s2Len + 1);
      ptr_00 = parasail_memalign_int(0x10,size);
      ptr_01 = parasail_memalign_int(0x10,size);
      if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
        local_68 = ((ppVar7->field_4).rowcols)->score_row;
        if (matrix->type == 0) {
          ptr_02 = parasail_memalign_int(0x10,(long)_s1Len);
          if (ptr_02 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar5 = matrix->mapper;
            uVar11 = 0;
            do {
              ptr_02[uVar11] = piVar5[(byte)_s1[uVar11]];
              uVar11 = uVar11 + 1;
            } while ((uint)_s1Len != uVar11);
          }
        }
        else {
          ptr_02 = (int *)0x0;
        }
        piVar5 = matrix->mapper;
        uVar11 = 0;
        do {
          ptr[uVar11] = piVar5[(byte)_s2[uVar11]];
          uVar11 = uVar11 + 1;
        } while (size_00 != uVar11);
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        uVar11 = 1;
        do {
          ptr_00[uVar11] = 0;
          ptr_01[uVar11] = -0x40000000;
          uVar11 = uVar11 + 1;
        } while (size != uVar11);
        if (_s1Len < 1) {
          local_a8 = -0x40000000;
        }
        else {
          uVar1 = _s1Len + 1;
          local_a8 = -0x40000000;
          uVar11 = 1;
          do {
            iVar3 = matrix->size;
            if (matrix->type == 0) {
              lVar12 = (long)ptr_02[uVar11 - 1];
            }
            else {
              lVar12 = uVar11 - 1;
            }
            piVar5 = matrix->matrix;
            iVar16 = *ptr_00;
            *ptr_00 = 0;
            uVar9 = (int)uVar11 - 1;
            iVar13 = -0x40000000;
            iVar14 = 0;
            lVar18 = 0;
            do {
              iVar4 = ptr_00[lVar18 + 1];
              iVar10 = iVar4 - open;
              iVar22 = ptr_01[lVar18 + 1] - gap;
              iVar17 = iVar22;
              if (iVar22 < iVar10) {
                iVar17 = iVar10;
              }
              ptr_01[lVar18 + 1] = iVar17;
              iVar20 = iVar14 - open;
              iVar15 = iVar13 - gap;
              iVar13 = iVar20;
              if (iVar20 <= iVar15) {
                iVar13 = iVar15;
              }
              iVar16 = iVar16 + piVar5[lVar12 * iVar3 + (long)ptr[lVar18]];
              iVar21 = iVar16;
              if (iVar16 <= iVar13) {
                iVar21 = iVar13;
              }
              if (iVar21 <= iVar17) {
                iVar21 = iVar17;
              }
              iVar14 = iVar21;
              if (iVar21 < 1) {
                iVar14 = 0;
              }
              lVar2 = lVar18 + 1;
              ptr_00[lVar18 + 1] = iVar14;
              iVar17 = (int)lVar18;
              uVar6 = uVar9;
              if ((iVar14 <= local_a8) &&
                 (iVar17 = s2Len, uVar6 = _s1Len, lVar2 <= s2Len && iVar14 == local_a8)) {
                iVar17 = (int)lVar18;
                uVar6 = uVar9;
              }
              _s1Len = uVar6;
              s2Len = iVar17;
              if (local_a8 <= iVar14) {
                local_a8 = iVar14;
              }
              bVar8 = ((iVar10 <= iVar22) << 5 | (iVar20 <= iVar15) << 3) + 0x28;
              *(byte *)((long)local_68 + lVar18) = bVar8;
              bVar19 = 4;
              if (iVar14 != iVar16) {
                bVar19 = (iVar14 == ptr_01[lVar18 + 1]) + 1;
              }
              if (iVar21 < 1) {
                bVar19 = 0;
              }
              *(byte *)((long)local_68 + lVar18) = bVar19 | bVar8;
              lVar18 = lVar2;
              iVar16 = iVar4;
            } while (size - 1 != lVar2);
            uVar11 = uVar11 + 1;
            local_68 = (int *)((long)local_68 + size_00);
          } while (uVar11 != uVar1);
        }
        ppVar7->score = local_a8;
        ppVar7->end_query = _s1Len;
        ppVar7->end_ref = s2Len;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar7;
        }
        return ppVar7;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int8_t * restrict HT = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = 0;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (WH > score) {
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                end_query = i-1;
                end_ref = j-1;
            }
            score = MAX(score,WH);
            HT[1LL*(i-1)*s2Len + (j-1)] = (F_opn > F_ext) ? PARASAIL_DIAG_F
                                                          : PARASAIL_DEL_F;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                           : PARASAIL_INS_E;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (WH == H_dag) ? PARASAIL_DIAG
                                        : (WH == F[j])   ? PARASAIL_DEL
                                                         : PARASAIL_INS;
            if (0 == WH) {
                HT[1LL*(i-1)*s2Len + (j-1)] &= PARASAIL_ZERO_MASK;
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}